

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZSkylineNSymStructMatrix.cpp
# Opt level: O0

void __thiscall
TPZSkylineNSymStructMatrix<double,_TPZStructMatrixOT<double>_>::TPZSkylineNSymStructMatrix
          (TPZSkylineNSymStructMatrix<double,_TPZStructMatrixOT<double>_> *this,TPZCompMesh *cmesh)

{
  TPZCompMesh *in_RSI;
  TPZSavable *in_RDI;
  TPZSkylineStructMatrix<double,_TPZStructMatrixOT<double>_> *unaff_retaddr;
  TPZSavable *vtt;
  
  vtt = in_RDI;
  TPZSavable::TPZSavable(in_RDI,&PTR_PTR_02578138);
  TPZStrMatParInterface::TPZStrMatParInterface
            ((TPZStrMatParInterface *)(in_RDI + 0x2c),&PTR_construction_vtable_136__02578128);
  TPZSkylineStructMatrix<double,_TPZStructMatrixOT<double>_>::TPZStructMatrix
            (unaff_retaddr,&vtt->_vptr_TPZSavable,in_RSI);
  in_RDI->_vptr_TPZSavable =
       (_func_int **)(TPZSkylineNSymStructMatrix<double,TPZStructMatrixOT<double>>::vtable + 0x68);
  in_RDI[0x2c]._vptr_TPZSavable =
       (_func_int **)(TPZSkylineNSymStructMatrix<double,TPZStructMatrixOT<double>>::vtable + 0x238);
  in_RDI->_vptr_TPZSavable =
       (_func_int **)(TPZSkylineNSymStructMatrix<double,TPZStructMatrixOT<double>>::vtable + 0x68);
  in_RDI[0x14]._vptr_TPZSavable =
       (_func_int **)(TPZSkylineNSymStructMatrix<double,TPZStructMatrixOT<double>>::vtable + 0x130);
  return;
}

Assistant:

TPZSkylineNSymStructMatrix<TVar,TPar>::TPZSkylineNSymStructMatrix(TPZCompMesh *cmesh)
  : TPZSkylineStructMatrix<TVar,TPar>(cmesh)
{
  ///nothing here
}